

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::listen_internal(Server *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auStack_c8 [8];
  fd_set fds;
  timeval local_40;
  
  this->is_running_ = true;
  bVar5 = true;
  do {
    iVar2 = this->svr_sock_;
    fds.fds_bits[0xd] = 0;
    fds.fds_bits[0xe] = 0;
    fds.fds_bits[0xb] = 0;
    fds.fds_bits[0xc] = 0;
    fds.fds_bits[9] = 0;
    fds.fds_bits[10] = 0;
    fds.fds_bits[7] = 0;
    fds.fds_bits[8] = 0;
    fds.fds_bits[5] = 0;
    fds.fds_bits[6] = 0;
    fds.fds_bits[3] = 0;
    fds.fds_bits[4] = 0;
    fds.fds_bits[1] = 0;
    fds.fds_bits[2] = 0;
    auStack_c8 = (undefined1  [8])0x0;
    fds.fds_bits[0] = 0;
    iVar1 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    fds.fds_bits[(long)(iVar1 >> 6) + -1] =
         fds.fds_bits[(long)(iVar1 >> 6) + -1] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    local_40.tv_sec = 0;
    local_40.tv_usec = 100000;
    iVar2 = select(iVar2 + 1,(fd_set *)auStack_c8,(fd_set *)0x0,(fd_set *)0x0,&local_40);
    if (iVar2 == 0) {
      bVar6 = this->svr_sock_ == -1;
    }
    else {
      iVar2 = accept(this->svr_sock_,(sockaddr *)0x0,(socklen_t *)0x0);
      if (iVar2 == -1) {
        bVar6 = true;
        if (this->svr_sock_ != -1) {
          close(this->svr_sock_);
          bVar5 = false;
        }
      }
      else {
        fds.fds_bits[0] = CONCAT44(fds.fds_bits[0]._4_4_,iVar2);
        auStack_c8 = (undefined1  [8])this;
        std::thread::thread<httplib::Server::listen_internal()::_lambda()_1_,,void>
                  ((thread *)&local_40,(anon_class_16_2_3fe5dd7f_for__M_head_impl *)auStack_c8);
        std::thread::detach();
        if (local_40.tv_sec != 0) goto LAB_0013c88f;
        bVar6 = false;
      }
    }
  } while (!bVar6);
  do {
    auStack_c8 = (undefined1  [8])0x0;
    fds.fds_bits[0] = 10000000;
    do {
      iVar2 = nanosleep((timespec *)auStack_c8,(timespec *)auStack_c8);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->running_threads_mutex_);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      if (local_40.tv_sec == 0) {
        _Unwind_Resume(uVar4);
      }
LAB_0013c88f:
      std::terminate();
    }
    iVar2 = this->running_threads_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->running_threads_mutex_);
    if (iVar2 == 0) {
      this->is_running_ = false;
      return bVar5;
    }
  } while( true );
}

Assistant:

inline bool Server::listen_internal()
{
    auto ret = true;

    is_running_ = true;

    for (;;) {
        auto val = detail::select_read(svr_sock_, 0, 100000);

        if (val == 0) { // Timeout
            if (svr_sock_ == INVALID_SOCKET) {
                // The server socket was closed by 'stop' method.
                break;
            }
            continue;
        }

        socket_t sock = accept(svr_sock_, NULL, NULL);

        if (sock == INVALID_SOCKET) {
            if (svr_sock_ != INVALID_SOCKET) {
                detail::close_socket(svr_sock_);
                ret = false;
            } else {
                ; // The server socket was closed by user.
            }
            break;
        }

        // TODO: Use thread pool...
        std::thread([=]() {
            {
                std::lock_guard<std::mutex> guard(running_threads_mutex_);
                running_threads_++;
            }

            read_and_close_socket(sock);

            {
                std::lock_guard<std::mutex> guard(running_threads_mutex_);
                running_threads_--;
            }
        }).detach();
    }

    // TODO: Use thread pool...
    for (;;) {
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        std::lock_guard<std::mutex> guard(running_threads_mutex_);
        if (!running_threads_) {
            break;
        }
    }

    is_running_ = false;

    return ret;
}